

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint32_t regime_el(CPUARMState_conflict *env,ARMMMUIdx mmu_idx)

{
  _Bool _Var1;
  ARMMMUIdx mmu_idx_local;
  CPUARMState_conflict *env_local;
  
  if (0x36 < mmu_idx - ARMMMUIdx_E10_0 && mmu_idx != ARMMMUIdx_MSPrivNegPri) {
LAB_00705ff6:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
               ,0x22ef,(char *)0x0);
  }
  switch((long)&switchD_00705fb2::switchdataD_013762d4 +
         (long)(int)(&switchD_00705fb2::switchdataD_013762d4)[mmu_idx - ARMMMUIdx_E10_0]) {
  case 0x705fb4:
    env_local._4_4_ = 2;
    break;
  case 0x705fbd:
    env_local._4_4_ = 3;
    break;
  case 0x705fc6:
    _Var1 = arm_el_is_aa64(env,3);
    env_local._4_4_ = 3;
    if (_Var1) {
      env_local._4_4_ = 1;
    }
    break;
  case 0x705feb:
    env_local._4_4_ = 1;
    break;
  case 0x705ff4:
    goto LAB_00705ff6;
  }
  return env_local._4_4_;
}

Assistant:

static uint32_t regime_el(CPUARMState *env, ARMMMUIdx mmu_idx)
{
    switch (mmu_idx) {
    case ARMMMUIdx_E20_0:
    case ARMMMUIdx_E20_2:
    case ARMMMUIdx_E20_2_PAN:
    case ARMMMUIdx_Stage2:
    case ARMMMUIdx_E2:
        return 2;
    case ARMMMUIdx_SE3:
        return 3;
    case ARMMMUIdx_SE10_0:
        return arm_el_is_aa64(env, 3) ? 1 : 3;
    case ARMMMUIdx_SE10_1:
    case ARMMMUIdx_SE10_1_PAN:
    case ARMMMUIdx_Stage1_E0:
    case ARMMMUIdx_Stage1_E1:
    case ARMMMUIdx_Stage1_E1_PAN:
    case ARMMMUIdx_E10_0:
    case ARMMMUIdx_E10_1:
    case ARMMMUIdx_E10_1_PAN:
    case ARMMMUIdx_MPrivNegPri:
    case ARMMMUIdx_MUserNegPri:
    case ARMMMUIdx_MPriv:
    case ARMMMUIdx_MUser:
    case ARMMMUIdx_MSPrivNegPri:
    case ARMMMUIdx_MSUserNegPri:
    case ARMMMUIdx_MSPriv:
    case ARMMMUIdx_MSUser:
        return 1;
    default:
        g_assert_not_reached();
        // never reach here
        return 1;
    }
}